

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_soft_max_ext_back_inplace
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float scale,float max_bias)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_soft_max_ext_back_impl(ctx,a,b,scale,max_bias,true);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_soft_max_ext_back_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 scale,
        float                 max_bias) {
    return ggml_soft_max_ext_back_impl(ctx, a, b, scale, max_bias, true);
}